

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O0

bool asio::detail::reactive_socket_send_op_base<asio::const_buffers_1>::do_perform(reactor_op *base)

{
  bool bVar1;
  size_t *in_stack_00000018;
  bool result;
  buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1> bufs;
  reactive_socket_send_op_base<asio::const_buffers_1> *o;
  const_buffers_1 *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1> local_28;
  
  buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::buffer_sequence_adapter
            ((buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1> *)
             CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
            );
  buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::buffers(&local_28);
  buffer_sequence_adapter<asio::const_buffer,_asio::const_buffers_1>::count(&local_28);
  bVar1 = socket_ops::non_blocking_send
                    ((socket_type)base,(buf *)o,bufs.total_buffer_size_,bufs.buffer_.iov_len._4_4_,
                     (error_code *)bufs.buffer_.iov_base,in_stack_00000018);
  return bVar1;
}

Assistant:

static bool do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    buffer_sequence_adapter<asio::const_buffer,
        ConstBufferSequence> bufs(o->buffers_);

    bool result = socket_ops::non_blocking_send(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->ec_, o->bytes_transferred_);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }